

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

bool __thiscall lume::Mesh::has(Mesh *this,GrobSet grobSet)

{
  bool bVar1;
  grob_t grobType_00;
  iterator iVar2;
  undefined1 local_40 [4];
  grob_t grobType;
  iterator __end2;
  iterator __begin2;
  GrobSet *__range2;
  Mesh *this_local;
  GrobSet grobSet_local;
  
  this_local._0_4_ = grobSet.m_offset;
  iVar2 = GrobSet::begin((GrobSet *)&this_local);
  __end2.set._0_4_ = iVar2.index;
  iVar2 = GrobSet::end((GrobSet *)&this_local);
  __end2._0_8_ = iVar2.set;
  local_40 = (undefined1  [4])iVar2.index;
  while( true ) {
    bVar1 = GrobSet::iterator::operator!=((iterator *)&__end2.set,(iterator *)local_40);
    if (!bVar1) {
      return false;
    }
    grobType_00 = GrobSet::iterator::operator*((iterator *)&__end2.set);
    bVar1 = has(this,grobType_00);
    if (bVar1) break;
    GrobSet::iterator::operator++((iterator *)&__end2.set);
  }
  return true;
}

Assistant:

bool has (const GrobSet grobSet) const
	{
		for (auto grobType : grobSet) {
			if (has (grobType))
				return true;
		}
		return false;
	}